

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall crnlib::crn_comp::optimize_alpha_selectors(crn_comp *this)

{
  unsigned_long_long uVar1;
  vector<unsigned_short> *this_00;
  unsigned_short uVar2;
  uint uVar3;
  unsigned_long_long *puVar4;
  unsigned_short *puVar5;
  long in_RDI;
  uint64 j;
  uint64 delta_selector;
  uint64 selector;
  uint error;
  uint16 i_2;
  uint min_error;
  uint16 selected_index;
  uint16 left;
  uint64 selected_selector;
  uint16 i_1;
  vector<unsigned_short> indices;
  vector<unsigned_long_long> selectors;
  uint16 i;
  uint8 D6 [4096];
  uint8 d [8];
  uint16 n;
  vector<unsigned_short> *remapping;
  uint in_stack_ffffffffffffeedc;
  undefined6 in_stack_ffffffffffffeee0;
  unsigned_short in_stack_ffffffffffffeee6;
  undefined8 in_stack_ffffffffffffeee8;
  vector<unsigned_short> *in_stack_ffffffffffffeef0;
  ulong local_1090;
  unsigned_long_long local_1088;
  ulong local_1080;
  uint local_1078;
  ushort local_1072;
  uint local_1070;
  ushort local_106c;
  ushort local_106a;
  unsigned_long_long local_1068;
  ushort local_105e;
  vector<unsigned_short> local_1050;
  vector<unsigned_long_long> local_1040;
  ushort local_102a;
  byte abStack_1028 [200];
  vector<unsigned_short> *in_stack_fffffffffffff0a0;
  vector<unsigned_char> *in_stack_fffffffffffff0a8;
  crn_comp *in_stack_fffffffffffff0b0;
  char local_1a [8];
  ushort local_12;
  vector<unsigned_short> *local_10;
  
  local_10 = (vector<unsigned_short> *)(in_RDI + 0x1f60);
  uVar3 = vector<unsigned_long_long>::size((vector<unsigned_long_long> *)(in_RDI + 0x1520));
  local_12 = (ushort)uVar3;
  vector<unsigned_short>::resize
            (in_stack_ffffffffffffeef0,(uint)((ulong)in_stack_ffffffffffffeee8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffeee8 >> 0x18,0));
  local_1a[0] = '\0';
  local_1a[1] = '\x02';
  local_1a[2] = '\x03';
  local_1a[3] = '\x03';
  local_1a[4] = '\x05';
  local_1a[5] = '\x05';
  local_1a[6] = '\x04';
  local_1a[7] = '\x04';
  for (local_102a = 0; local_102a < 0x1000; local_102a = local_102a + 1) {
    abStack_1028[local_102a] =
         local_1a[(int)(((uint)local_102a ^ (int)(uint)local_102a >> 6) & 7)] +
         local_1a[(int)(((int)(uint)local_102a >> 3 ^ (int)(uint)local_102a >> 9) & 7)];
  }
  vector<unsigned_long_long>::vector
            ((vector<unsigned_long_long> *)
             CONCAT26(in_stack_ffffffffffffeee6,in_stack_ffffffffffffeee0),in_stack_ffffffffffffeedc
            );
  vector<unsigned_short>::vector
            ((vector<unsigned_short> *)CONCAT26(in_stack_ffffffffffffeee6,in_stack_ffffffffffffeee0)
             ,in_stack_ffffffffffffeedc);
  for (local_105e = 0; local_105e < local_12; local_105e = local_105e + 1) {
    puVar4 = vector<unsigned_long_long>::operator[]
                       ((vector<unsigned_long_long> *)(in_RDI + 0x1520),(uint)local_105e);
    uVar1 = *puVar4;
    puVar4 = vector<unsigned_long_long>::operator[](&local_1040,(uint)local_105e);
    *puVar4 = uVar1;
    puVar5 = vector<unsigned_short>::operator[](&local_1050,(uint)local_105e);
    *puVar5 = local_105e;
  }
  local_1068 = 0;
  local_106a = local_12;
  while (local_106a != 0) {
    local_106c = 0;
    local_1070 = 0xffffffff;
    for (local_1072 = 0; local_1072 < local_106a; local_1072 = local_1072 + 1) {
      local_1078 = 0;
      puVar4 = vector<unsigned_long_long>::operator[](&local_1040,(uint)local_1072);
      local_1080 = *puVar4 << 6;
      local_1088 = local_1068;
      for (local_1090 = 0; local_1090 < 8; local_1090 = local_1090 + 1) {
        local_1078 = abStack_1028[local_1080 & 0xfc0 | local_1088 & 0x3f] + local_1078;
        local_1080 = local_1080 >> 6;
        local_1088 = local_1088 >> 6;
      }
      if (local_1078 < local_1070) {
        local_1070 = local_1078;
        local_106c = local_1072;
      }
    }
    puVar4 = vector<unsigned_long_long>::operator[](&local_1040,(uint)local_106c);
    this_00 = local_10;
    local_1068 = *puVar4;
    uVar2 = local_12 - local_106a;
    puVar5 = vector<unsigned_short>::operator[](&local_1050,(uint)local_106c);
    puVar5 = vector<unsigned_short>::operator[](this_00,(uint)*puVar5);
    *puVar5 = uVar2;
    local_106a = local_106a - 1;
    puVar4 = vector<unsigned_long_long>::operator[](&local_1040,(uint)local_106a);
    uVar1 = *puVar4;
    puVar4 = vector<unsigned_long_long>::operator[](&local_1040,(uint)local_106c);
    *puVar4 = uVar1;
    puVar5 = vector<unsigned_short>::operator[](&local_1050,(uint)local_106a);
    in_stack_ffffffffffffeee6 = *puVar5;
    puVar5 = vector<unsigned_short>::operator[](&local_1050,(uint)local_106c);
    *puVar5 = in_stack_ffffffffffffeee6;
  }
  pack_alpha_selectors
            (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
  vector<unsigned_short>::~vector
            ((vector<unsigned_short> *)CONCAT26(in_stack_ffffffffffffeee6,in_stack_ffffffffffffeee0)
            );
  vector<unsigned_long_long>::~vector
            ((vector<unsigned_long_long> *)
             CONCAT26(in_stack_ffffffffffffeee6,in_stack_ffffffffffffeee0));
  return;
}

Assistant:

void crn_comp::optimize_alpha_selectors() {
  crnlib::vector<uint16>& remapping = m_selector_remaping[cAlpha0];
  uint16 n = m_alpha_selectors.size();
  remapping.resize(n);

  uint8 d[] = {0, 2, 3, 3, 5, 5, 4, 4};

  uint8 D6[0x1000];
  for (uint16 i = 0; i < 0x1000; i++)
    D6[i] = d[(i ^ i >> 6) & 7] + d[(i >> 3 ^ i >> 9) & 7];

  crnlib::vector<uint64> selectors(n);
  crnlib::vector<uint16> indices(n);
  for (uint16 i = 0; i < n; i++) {
    selectors[i] = m_alpha_selectors[i];
    indices[i] = i;
  }
  uint64 selected_selector = 0;
  for (uint16 left = n; left;) {
    uint16 selected_index = 0;
    uint min_error = cUINT32_MAX;
    for (uint16 i = 0; i < left; i++) {
      uint error = 0;
      for (uint64 selector = selectors[i] << 6, delta_selector = selected_selector, j = 0; j < 8; j++, selector >>= 6, delta_selector >>= 6)
        error += D6[(selector & 0xFC0) | (delta_selector & 0x3F)];
      if (error < min_error) {
        min_error = error;
        selected_index = i;
      }
    }
    selected_selector = selectors[selected_index];
    remapping[indices[selected_index]] = n - left;
    left--;
    selectors[selected_index] = selectors[left];
    indices[selected_index] = indices[left];
  }

  pack_alpha_selectors(m_packed_alpha_selectors, remapping);
}